

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int renameEditSql(sqlite3_context *pCtx,RenameCtx *pRename,char *zSql,char *zNew,int bQuote)

{
  long lVar1;
  sqlite3 *db;
  RenameToken *pRVar2;
  RenameCtx *pRVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  char *z;
  uint uVar8;
  RenameCtx *pRVar9;
  char *z_00;
  char *pcVar10;
  uint uVar11;
  int iVar12;
  RenameToken *pBest;
  RenameToken *p;
  char *local_98;
  char *local_90;
  size_t local_78;
  
  uVar8 = 0;
  if (zNew != (char *)0x0) {
    sVar7 = strlen(zNew);
    uVar8 = (uint)sVar7 & 0x3fffffff;
  }
  local_78 = 0;
  if (zSql != (char *)0x0) {
    sVar7 = strlen(zSql);
    local_78 = (size_t)((uint)sVar7 & 0x3fffffff);
  }
  db = pCtx->pOut->db;
  if (zNew == (char *)0x0) {
    lVar1 = local_78 * 2 + 1;
    z = (char *)sqlite3DbMallocZero(db,lVar1 * 3);
    if (z == (char *)0x0) {
      local_98 = (char *)0x0;
      z = (char *)0x0;
      iVar4 = 0;
      z_00 = (char *)0x0;
      local_90 = (char *)0x0;
    }
    else {
      z_00 = z + lVar1;
      local_90 = z + local_78 * 4 + 2;
      local_98 = (char *)0x0;
      iVar4 = 0;
    }
  }
  else {
    local_98 = sqlite3MPrintf(db,"\"%w\" ",zNew);
    if (local_98 == (char *)0x0) {
      return 7;
    }
    sVar7 = strlen(local_98);
    iVar4 = ((uint)sVar7 & 0x3fffffff) - 1;
    z = (char *)sqlite3DbMallocZero(db,local_78 + (long)pRename->nList * (long)iVar4 + 1);
    z_00 = (char *)0x0;
    local_90 = (char *)0x0;
  }
  if (z == (char *)0x0) {
    iVar4 = 7;
  }
  else {
    memcpy(z,zSql,local_78);
    p = pRename->pList;
    if (p != (RenameToken *)0x0) {
      iVar5 = (int)local_78;
      do {
        for (pRVar2 = p->pNext; pRVar3 = pRename, pRVar2 != (RenameToken *)0x0;
            pRVar2 = pRVar2->pNext) {
          if ((p->t).z < (pRVar2->t).z) {
            p = pRVar2;
          }
        }
        do {
          pRVar9 = pRVar3;
          pRVar2 = pRVar9->pList;
          pRVar3 = (RenameCtx *)&pRVar2->pNext;
        } while (pRVar2 != p);
        pRVar9->pList = p->pNext;
        if (zNew == (char *)0x0) {
          memcpy(z_00,(p->t).z,(ulong)(p->t).n);
          z_00[(p->t).n] = '\0';
          sqlite3Dequote(z_00);
          pcVar10 = "";
          if ((p->t).z[(p->t).n] == '\'') {
            pcVar10 = " ";
          }
          uVar11 = 0;
          sqlite3_snprintf(iVar5 * 2,local_90,"%Q%s",z_00,pcVar10);
          pcVar10 = local_90;
          if (local_90 != (char *)0x0) {
            sVar7 = strlen(local_90);
            uVar11 = (uint)sVar7 & 0x3fffffff;
          }
        }
        else if ((bQuote != 0) ||
                (pcVar10 = zNew, uVar11 = uVar8, (""[(byte)*(p->t).z] & 0x46) == 0)) {
          pcVar10 = local_98;
          uVar11 = (uint)((p->t).z[(p->t).n] == '\"') + iVar4;
        }
        iVar12 = (int)(p->t).z - (int)zSql;
        uVar6 = (p->t).n;
        if (uVar6 != uVar11) {
          uVar6 = uVar6 + iVar12;
          memmove(z + (iVar12 + uVar11),z + uVar6,(ulong)((int)local_78 - uVar6));
          uVar6 = (int)local_78 + (uVar11 - (p->t).n);
          local_78 = (size_t)uVar6;
          z[(int)uVar6] = '\0';
        }
        memcpy(z + iVar12,pcVar10,(ulong)uVar11);
        if (p != (RenameToken *)0x0) {
          sqlite3DbFreeNN(db,p);
        }
        p = pRename->pList;
      } while (p != (RenameToken *)0x0);
    }
    setResultStrOrError(pCtx,z,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3DbFreeNN(db,z);
    iVar4 = 0;
  }
  sqlite3_free(local_98);
  return iVar4;
}

Assistant:

static int renameEditSql(
  sqlite3_context *pCtx,          /* Return result here */
  RenameCtx *pRename,             /* Rename context */
  const char *zSql,               /* SQL statement to edit */
  const char *zNew,               /* New token text */
  int bQuote                      /* True to always quote token */
){
  i64 nNew = sqlite3Strlen30(zNew);
  i64 nSql = sqlite3Strlen30(zSql);
  sqlite3 *db = sqlite3_context_db_handle(pCtx);
  int rc = SQLITE_OK;
  char *zQuot = 0;
  char *zOut;
  i64 nQuot = 0;
  char *zBuf1 = 0;
  char *zBuf2 = 0;

  if( zNew ){
    /* Set zQuot to point to a buffer containing a quoted copy of the
    ** identifier zNew. If the corresponding identifier in the original
    ** ALTER TABLE statement was quoted (bQuote==1), then set zNew to
    ** point to zQuot so that all substitutions are made using the
    ** quoted version of the new column name.  */
    zQuot = sqlite3MPrintf(db, "\"%w\" ", zNew);
    if( zQuot==0 ){
      return SQLITE_NOMEM;
    }else{
      nQuot = sqlite3Strlen30(zQuot)-1;
    }

    assert( nQuot>=nNew );
    zOut = sqlite3DbMallocZero(db, nSql + pRename->nList*nQuot + 1);
  }else{
    zOut = (char*)sqlite3DbMallocZero(db, (nSql*2+1) * 3);
    if( zOut ){
      zBuf1 = &zOut[nSql*2+1];
      zBuf2 = &zOut[nSql*4+2];
    }
  }

  /* At this point pRename->pList contains a list of RenameToken objects
  ** corresponding to all tokens in the input SQL that must be replaced
  ** with the new column name, or with single-quoted versions of themselves.
  ** All that remains is to construct and return the edited SQL string. */
  if( zOut ){
    int nOut = nSql;
    memcpy(zOut, zSql, nSql);
    while( pRename->pList ){
      int iOff;                   /* Offset of token to replace in zOut */
      u32 nReplace;
      const char *zReplace;
      RenameToken *pBest = renameColumnTokenNext(pRename);

      if( zNew ){
        if( bQuote==0 && sqlite3IsIdChar(*pBest->t.z) ){
          nReplace = nNew;
          zReplace = zNew;
        }else{
          nReplace = nQuot;
          zReplace = zQuot;
          if( pBest->t.z[pBest->t.n]=='"' ) nReplace++;
        }
      }else{
        /* Dequote the double-quoted token. Then requote it again, this time
        ** using single quotes. If the character immediately following the
        ** original token within the input SQL was a single quote ('), then
        ** add another space after the new, single-quoted version of the
        ** token. This is so that (SELECT "string"'alias') maps to
        ** (SELECT 'string' 'alias'), and not (SELECT 'string''alias').  */
        memcpy(zBuf1, pBest->t.z, pBest->t.n);
        zBuf1[pBest->t.n] = 0;
        sqlite3Dequote(zBuf1);
        sqlite3_snprintf(nSql*2, zBuf2, "%Q%s", zBuf1,
            pBest->t.z[pBest->t.n]=='\'' ? " " : ""
        );
        zReplace = zBuf2;
        nReplace = sqlite3Strlen30(zReplace);
      }

      iOff = pBest->t.z - zSql;
      if( pBest->t.n!=nReplace ){
        memmove(&zOut[iOff + nReplace], &zOut[iOff + pBest->t.n],
            nOut - (iOff + pBest->t.n)
        );
        nOut += nReplace - pBest->t.n;
        zOut[nOut] = '\0';
      }
      memcpy(&zOut[iOff], zReplace, nReplace);
      sqlite3DbFree(db, pBest);
    }

    sqlite3_result_text(pCtx, zOut, -1, SQLITE_TRANSIENT);
    sqlite3DbFree(db, zOut);
  }else{
    rc = SQLITE_NOMEM;
  }

  sqlite3_free(zQuot);
  return rc;
}